

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O3

Point shrinkChunk(Image *chunk)

{
  value_type vVar1;
  uint uVar2;
  Size SVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint8_t *puVar10;
  int iVar11;
  pointer pCVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  pointer pCVar16;
  value_type vVar17;
  long lVar18;
  pointer pCVar19;
  uint8_t *puVar20;
  Image out;
  allocator_type local_69;
  undefined8 local_68;
  value_type local_60;
  uint uStack_5c;
  value_type local_58;
  uint uStack_54;
  Image local_50;
  
  local_68 = 0;
  local_68._4_4_ = 0;
  vVar1 = (value_type)(chunk->size).width;
  lVar5 = (long)(int)vVar1;
  uVar2 = (chunk->size).height;
  lVar4 = (long)(int)uVar2;
  uVar9 = uVar2;
  uStack_5c = uVar2;
  if (lVar4 < 1) {
    uVar15 = 0;
LAB_0010d769:
    iVar14 = (int)uVar15;
    if (iVar14 < (int)(uVar2 - 1)) {
      pCVar12 = (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar6 = lVar4 + -1;
      do {
        pCVar19 = pCVar12 + lVar6 * lVar5;
        lVar18 = (long)(int)((int)vVar1 * (uint)lVar4);
        uVar7 = lVar18 * 4 + lVar6 * lVar5 * -4;
        pCVar16 = pCVar12 + lVar18;
        if (0 < (long)uVar7 >> 4) {
          uVar8 = uVar7 & 0xfffffffffffffff0;
          puVar10 = &pCVar19->r;
          lVar18 = ((long)uVar7 >> 4) + 1;
          do {
            if (0xffffff < (uint)*pCVar19) goto LAB_0010d85d;
            if (0xffffff < (uint)pCVar19[1]) {
              pCVar19 = pCVar19 + 1;
              goto LAB_0010d85d;
            }
            if (0xffffff < (uint)pCVar19[2]) {
              pCVar19 = pCVar19 + 2;
              goto LAB_0010d85d;
            }
            if (0xffffff < (uint)pCVar19[3]) {
              pCVar19 = pCVar19 + 3;
              goto LAB_0010d85d;
            }
            pCVar19 = pCVar19 + 4;
            lVar18 = lVar18 + -1;
          } while (1 < lVar18);
          uVar7 = (long)pCVar16 - (long)(puVar10 + uVar8);
          pCVar19 = (pointer)(puVar10 + uVar8);
        }
        lVar18 = (long)uVar7 >> 2;
        if (lVar18 == 1) {
LAB_0010d851:
          if (0xffffff < (uint)*pCVar19) goto LAB_0010d85d;
        }
        else {
          if (lVar18 == 2) {
LAB_0010d82d:
            if ((uint)*pCVar19 < 0x1000000) {
              pCVar19 = pCVar19 + 1;
              goto LAB_0010d851;
            }
          }
          else {
            if (lVar18 != 3) goto LAB_0010d862;
            if ((uint)*pCVar19 < 0x1000000) {
              pCVar19 = pCVar19 + 1;
              goto LAB_0010d82d;
            }
          }
LAB_0010d85d:
          uVar9 = (uint)lVar4;
          if (pCVar19 != pCVar16) break;
        }
LAB_0010d862:
        uStack_5c = (uint)lVar6;
        lVar6 = lVar6 + -1;
        lVar4 = lVar4 + -1;
        uVar9 = iVar14 + 1;
      } while (iVar14 < lVar6);
    }
  }
  else {
    pCVar19 = (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar12 = pCVar19 + 2;
    uVar15 = 0;
    do {
      pCVar16 = pCVar19 + uVar15 * lVar5;
      lVar6 = lVar5;
      if (0 < lVar5 >> 2) {
        puVar10 = &pCVar16->r;
        lVar6 = (lVar5 >> 2) + 1;
        pCVar16 = pCVar12;
        do {
          if (0xffffff < (uint)pCVar16[-2]) {
            pCVar16 = pCVar16 + -2;
            goto LAB_0010d745;
          }
          if (0xffffff < (uint)pCVar16[-1]) {
            pCVar16 = pCVar16 + -1;
            goto LAB_0010d745;
          }
          if (0xffffff < (uint)*pCVar16) goto LAB_0010d745;
          if (0xffffff < (uint)pCVar16[1]) {
            pCVar16 = pCVar16 + 1;
            goto LAB_0010d745;
          }
          lVar6 = lVar6 + -1;
          pCVar16 = pCVar16 + 4;
        } while (1 < lVar6);
        lVar6 = (long)(pCVar19 + uVar15 * lVar5 + lVar5) -
                (long)(puVar10 + (lVar5 * 4 & 0xfffffffffffffff0)) >> 2;
        pCVar16 = (pointer)(puVar10 + (lVar5 * 4 & 0xfffffffffffffff0));
      }
      if (lVar6 == 1) {
LAB_0010d739:
        if (0xffffff < (uint)*pCVar16) goto LAB_0010d745;
      }
      else {
        if (lVar6 == 2) {
LAB_0010d715:
          if ((uint)*pCVar16 < 0x1000000) {
            pCVar16 = pCVar16 + 1;
            goto LAB_0010d739;
          }
        }
        else {
          if (lVar6 != 3) goto LAB_0010d74a;
          if ((uint)*pCVar16 < 0x1000000) {
            pCVar16 = pCVar16 + 1;
            goto LAB_0010d715;
          }
        }
LAB_0010d745:
        if (pCVar16 != pCVar19 + uVar15 * lVar5 + lVar5) goto LAB_0010d769;
      }
LAB_0010d74a:
      uVar15 = uVar15 + 1;
      uVar13 = (uint)uVar15;
      local_68 = uVar15 << 0x20;
      pCVar12 = pCVar12 + lVar5;
    } while (uVar2 != uVar13);
    uVar15 = (ulong)uVar2;
    local_68._4_4_ = uVar13;
  }
  iVar14 = (int)uVar15;
  local_60 = vVar1;
  if ((int)vVar1 < 1) {
    vVar17.r = '\0';
    vVar17.g = '\0';
    vVar17.b = '\0';
    vVar17.a = '\0';
LAB_0010d8d9:
    local_68 = CONCAT44(local_68._4_4_,vVar17);
    if ((int)vVar17 < (int)((int)vVar1 - 1U)) {
      lVar4 = lVar5 + -1;
      puVar10 = &(chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                 super__Vector_impl_data._M_start[((long)iVar14 + 1) * lVar5 + -1].a;
      do {
        puVar20 = puVar10;
        iVar11 = uVar9 - iVar14;
        if (iVar14 < (int)uVar9) {
          do {
            if (*puVar20 != '\0') goto LAB_0010d93b;
            puVar20 = puVar20 + lVar5 * 4;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        local_60 = SUB84(lVar4,0);
        lVar4 = lVar4 + -1;
        puVar10 = puVar10 + -4;
      } while ((int)vVar17 < lVar4);
    }
  }
  else {
    puVar10 = &(chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start[(long)iVar14 * (ulong)(uint)vVar1].a;
    vVar17.r = '\0';
    vVar17.g = '\0';
    vVar17.b = '\0';
    vVar17.a = '\0';
    do {
      puVar20 = puVar10;
      iVar11 = uVar9 - iVar14;
      if (iVar14 < (int)uVar9) {
        do {
          if (*puVar20 != '\0') goto LAB_0010d8d9;
          puVar20 = puVar20 + (ulong)(uint)vVar1 * 4;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      vVar17 = (value_type)((int)vVar17 + 1);
      puVar10 = puVar10 + 4;
    } while (vVar1 != vVar17);
    local_68 = CONCAT44(local_68._4_4_,vVar1);
    vVar17 = vVar1;
  }
LAB_0010d93b:
  local_50.size.width = 0;
  local_50.size.height = 0;
  if ((local_68 != 0) ||
     (SVar3.height = uStack_5c, SVar3.width._0_1_ = local_60.r, SVar3.width._1_1_ = local_60.g,
     SVar3.width._2_1_ = local_60.b, SVar3.width._3_1_ = local_60.a, local_58 = vVar1,
     uStack_54 = uVar2, SVar3 != chunk->size)) {
    uVar9 = uVar9 - iVar14;
    if (uVar9 != 0) {
      local_50.size.height = uVar9;
      local_50.size.width = (int)local_60 - (int)vVar17;
      local_58.r = '\0';
      local_58.g = '\0';
      local_58.b = '\0';
      local_58.a = '\0';
      std::vector<Color,_std::allocator<Color>_>::vector
                (&local_50.colorData,
                 (long)(((ulong)uVar9 << 0x20) * (ulong)(uint)((int)local_60 - (int)vVar17)) >> 0x20
                 ,&local_58,&local_69);
      uVar15 = uVar15 << 0x20;
      uVar7 = (ulong)(uint)vVar17;
      Image::drawOnto(chunk,&local_50,(Point)0x0,(Point)(uVar15 + uVar7),local_50.size);
      chunk->size = local_50.size;
      pCVar12 = (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar19 = (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
      (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (chunk->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pCVar12 != (pointer)0x0) &&
         (operator_delete(pCVar12,(long)pCVar19 - (long)pCVar12),
         local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0010da39;
    }
    (chunk->size).width = 1;
    (chunk->size).height = 1;
    std::vector<Color,_std::allocator<Color>_>::resize(&chunk->colorData,1);
  }
  uVar7 = 0;
  uVar15 = 0;
LAB_0010da39:
  return (Point)(uVar7 | uVar15);
}

Assistant:

Point shrinkChunk(Image& chunk) {
	Point start {0, 0};
	Point end {chunk.size.width, chunk.size.height};
	for (; start.y < end.y; start.y++) { // Shrink from top
		if (std::any_of(&chunk.pixel(start.x, start.y), &chunk.pixel(end.x, start.y), [](Color c){ return c.a > 0; })) {
			break;
		}
	}
	for (; start.y < end.y - 1; end.y--) { // Shrink from bottom
		if (std::any_of(&chunk.pixel(start.x, end.y - 1), &chunk.pixel(end.x, end.y - 1), [](Color c){ return c.a > 0; })) {
			break;
		}
	}
	for (; start.x < end.x; start.x++) { // Shrink from left
		for (int y = start.y; y < end.y; y++) {
			if (chunk.pixel(start.x, y).a > 0)
				goto leftfound;
		}
	}
leftfound:
	for(; start.x < end.x - 1; end.x--) { // Shrink from right
		for (int y = start.y; y < end.y; y++) {
			if (chunk.pixel(end.x - 1, y).a > 0)
				goto rightfound;
		}
	}
rightfound:
	if (start == Point{0, 0} && end == Point{chunk.size.width, chunk.size.height}) {
		// No resizing possible
		return {0, 0};
	} else if (start.y == end.y) {
		// TODO: Be able to remove empty chunks
		chunk.fastResize({1, 1});
		return {0, 0};
	} else {
		Image out({end.x - start.x, end.y - start.y});
		chunk.drawOnto(out, {0, 0}, {start.x, start.y}, out.size);
		chunk = std::move(out);
		return {start.x, start.y};
	}
}